

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::AsmJsByteCodeWriter::AsmReg18
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8,RegSlot R9,RegSlot R10,RegSlot R11,
          RegSlot R12,RegSlot R13,RegSlot R14,RegSlot R15,RegSlot R16,RegSlot R17)

{
  Data *this_00;
  bool bVar1;
  RegSlot local_90;
  RegSlot local_8c;
  RegSlot local_88;
  RegSlot local_84;
  RegSlot local_80;
  RegSlot local_7c;
  RegSlot local_78;
  RegSlot local_74;
  RegSlot local_70;
  RegSlot local_6c;
  RegSlot local_68;
  RegSlot local_64;
  RegSlot local_60;
  RegSlot local_5c;
  RegSlot local_58;
  RegSlot local_54;
  RegSlot local_50;
  RegSlot local_4c;
  ByteCodeWriter *local_48;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  local_48 = &this->super_ByteCodeWriter;
  local_40 = R3;
  local_3c = R2;
  local_38 = R1;
  local_34 = R0;
  bVar1 = TryWriteAsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,R0,R1,R2,R3,R4,R5,R6,R7,R8,R9,R10,R11,R12,R13,R14,R15,R16,R17);
  if (!bVar1) {
    bVar1 = TryWriteAsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      ((AsmJsByteCodeWriter *)local_48,op,local_34,local_38,local_3c,local_40,R4,R5,
                       R6,R7,R8,R9,R10,R11,R12,R13,R14,R15,R16,R17);
    if (!bVar1) {
      local_90 = local_34;
      local_8c = local_38;
      local_88 = local_3c;
      local_84 = local_40;
      local_80 = R4;
      local_7c = R5;
      local_78 = R6;
      local_74 = R7;
      local_70 = R8;
      local_6c = R9;
      local_68 = R10;
      local_64 = R11;
      local_60 = R12;
      local_5c = R13;
      local_58 = R14;
      local_54 = R15;
      local_50 = R16;
      local_4c = R17;
      this_00 = &local_48->m_byteCodeData;
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,local_48,false);
      ByteCodeWriter::Data::Write(this_00,&local_90,0x48);
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmReg18(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8,
        RegSlot R9, RegSlot R10, RegSlot R11, RegSlot R12, RegSlot R13, RegSlot R14, RegSlot R15, RegSlot R16, RegSlot R17)
    {
        MULTISIZE_LAYOUT_WRITE(AsmReg18, op, R0, R1, R2, R3, R4, R5, R6, R7, R8, R9, R10, R11, R12, R13, R14, R15, R16, R17);
    }